

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resFilter.c
# Opt level: O0

int Res_FilterCandidatesArea
              (Res_Win_t *pWin,Abc_Ntk_t *pAig,Res_Sim_t *pSim,Vec_Vec_t *vResubs,
              Vec_Vec_t *vResubsW,int nFaninsMax)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint *puVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  uint *puVar8;
  void *pvVar9;
  uint *r;
  int iBest;
  int iDiv2;
  int iDiv;
  int k;
  int d2;
  int d;
  int RetValue;
  int Counter;
  uint *pInfoDiv2;
  uint *pInfoDiv;
  uint *pInfo;
  Abc_Obj_t *pFanin;
  int nFaninsMax_local;
  Vec_Vec_t *vResubsW_local;
  Vec_Vec_t *vResubs_local;
  Res_Sim_t *pSim_local;
  Abc_Ntk_t *pAig_local;
  Res_Win_t *pWin_local;
  
  puVar5 = (uint *)Vec_PtrEntry(pSim->vOuts,1);
  iVar1 = Abc_InfoIsOne(puVar5,pSim->nWordsOut);
  if (iVar1 == 0) {
    pWin_local._4_4_ = 0;
  }
  else {
    puVar5 = Res_FilterCollectFaninInfo(pWin,pSim,0xffffffff);
    iVar1 = Abc_InfoIsOne(puVar5,pSim->nWordsOut);
    if (iVar1 == 0) {
      pWin_local._4_4_ = 0;
    }
    else {
      d = 0;
      Vec_VecClear(vResubs);
      Vec_VecClear(vResubsW);
      iVar1 = Res_FilterCriticalFanin(pWin->pNode);
      if (iVar1 == -1) {
        pWin_local._4_4_ = 0;
      }
      else {
        puVar5 = Res_FilterCollectFaninInfo(pWin,pSim,1 << ((byte)iVar1 & 0x1f) ^ 0xffffffff);
        iVar2 = Abc_InfoIsOne(puVar5,pSim->nWordsOut);
        if (iVar2 == 0) {
          iVar2 = Abc_ObjFaninNum(pWin->pNode);
          for (k = iVar2 + 2; iVar2 = Abc_NtkPoNum(pAig), k < iVar2; k = k + 1) {
            puVar8 = (uint *)Vec_PtrEntry(pSim->vOuts,k);
            iVar2 = Abc_ObjFaninNum(pWin->pNode);
            iVar3 = Abc_InfoIsOrOne(puVar5,puVar8,pSim->nWordsOut);
            if (iVar3 != 0) {
              pAVar6 = Abc_NtkPo(pAig,0);
              Vec_VecPush(vResubs,d,pAVar6);
              pAVar6 = Abc_NtkPo(pAig,1);
              Vec_VecPush(vResubs,d,pAVar6);
              for (iDiv2 = 0; iVar3 = Abc_ObjFaninNum(pWin->pNode), iDiv2 < iVar3; iDiv2 = iDiv2 + 1
                  ) {
                pAVar6 = Abc_ObjFanin(pWin->pNode,iDiv2);
                if (iDiv2 != iVar1) {
                  pAVar7 = Abc_NtkPo(pAig,iDiv2 + 2);
                  Vec_VecPush(vResubs,d,pAVar7);
                  Vec_VecPush(vResubsW,d,pAVar6);
                }
              }
              pAVar6 = Abc_NtkPo(pAig,k);
              Vec_VecPush(vResubs,d,pAVar6);
              pvVar9 = Vec_PtrEntry(pWin->vDivs,k - (iVar2 + 2));
              Vec_VecPush(vResubsW,d,pvVar9);
              d = d + 1;
              iVar2 = Vec_VecSize(vResubs);
              if (d == iVar2) break;
            }
          }
          if ((d < 1) && (iVar2 = Abc_ObjFaninNum(pWin->pNode), iVar2 < nFaninsMax)) {
            iVar2 = Abc_ObjFaninNum(pWin->pNode);
            for (k = iVar2 + 2; iVar2 = Abc_NtkPoNum(pAig), k < iVar2; k = k + 1) {
              puVar8 = (uint *)Vec_PtrEntry(pSim->vOuts,k);
              iVar2 = Abc_ObjFaninNum(pWin->pNode);
              iDiv = k;
              do {
                do {
                  iDiv = iDiv + 1;
                  iVar3 = Abc_NtkPoNum(pAig);
                  if (iVar3 <= iDiv) goto LAB_005bfade;
                  r = (uint *)Vec_PtrEntry(pSim->vOuts,iDiv);
                  iVar3 = Abc_ObjFaninNum(pWin->pNode);
                  iVar4 = Abc_InfoIsOrOne3(puVar5,puVar8,r,pSim->nWordsOut);
                } while (iVar4 == 0);
                pAVar6 = Abc_NtkPo(pAig,0);
                Vec_VecPush(vResubs,d,pAVar6);
                pAVar6 = Abc_NtkPo(pAig,1);
                Vec_VecPush(vResubs,d,pAVar6);
                for (iDiv2 = 0; iVar4 = Abc_ObjFaninNum(pWin->pNode), iDiv2 < iVar4;
                    iDiv2 = iDiv2 + 1) {
                  pAVar6 = Abc_ObjFanin(pWin->pNode,iDiv2);
                  if (iDiv2 != iVar1) {
                    pAVar7 = Abc_NtkPo(pAig,iDiv2 + 2);
                    Vec_VecPush(vResubs,d,pAVar7);
                    Vec_VecPush(vResubsW,d,pAVar6);
                  }
                }
                pAVar6 = Abc_NtkPo(pAig,k);
                Vec_VecPush(vResubs,d,pAVar6);
                pAVar6 = Abc_NtkPo(pAig,iDiv);
                Vec_VecPush(vResubs,d,pAVar6);
                pvVar9 = Vec_PtrEntry(pWin->vDivs,k - (iVar2 + 2));
                Vec_VecPush(vResubsW,d,pvVar9);
                pvVar9 = Vec_PtrEntry(pWin->vDivs,iDiv - (iVar3 + 2));
                Vec_VecPush(vResubsW,d,pvVar9);
                d = d + 1;
                iVar3 = Vec_VecSize(vResubs);
              } while (d != iVar3);
LAB_005bfade:
              iVar2 = Vec_VecSize(vResubs);
              if (d == iVar2) break;
            }
            pWin_local._4_4_ = d;
          }
          else {
            pWin_local._4_4_ = d;
          }
        }
        else {
          pAVar6 = Abc_NtkPo(pAig,0);
          Vec_VecPush(vResubs,0,pAVar6);
          pAVar6 = Abc_NtkPo(pAig,1);
          Vec_VecPush(vResubs,0,pAVar6);
          for (iDiv2 = 0; iVar2 = Abc_ObjFaninNum(pWin->pNode), iDiv2 < iVar2; iDiv2 = iDiv2 + 1) {
            pAVar6 = Abc_ObjFanin(pWin->pNode,iDiv2);
            if (iDiv2 != iVar1) {
              pAVar7 = Abc_NtkPo(pAig,iDiv2 + 2);
              Vec_VecPush(vResubs,0,pAVar7);
              Vec_VecPush(vResubsW,0,pAVar6);
            }
          }
          pWin_local._4_4_ = 1;
        }
      }
    }
  }
  return pWin_local._4_4_;
}

Assistant:

int Res_FilterCandidatesArea( Res_Win_t * pWin, Abc_Ntk_t * pAig, Res_Sim_t * pSim, Vec_Vec_t * vResubs, Vec_Vec_t * vResubsW, int nFaninsMax )
{
    Abc_Obj_t * pFanin;
    unsigned * pInfo, * pInfoDiv, * pInfoDiv2;
    int Counter, RetValue, d, d2, k, iDiv, iDiv2, iBest;

    // check that the info the node is one
    pInfo = (unsigned *)Vec_PtrEntry( pSim->vOuts, 1 );
    RetValue = Abc_InfoIsOne( pInfo, pSim->nWordsOut );
    if ( RetValue == 0 )
    {
//        printf( "Failed 1!\n" );
        return 0;
    }

    // collect the fanin info
    pInfo = Res_FilterCollectFaninInfo( pWin, pSim, ~0 );
    RetValue = Abc_InfoIsOne( pInfo, pSim->nWordsOut );
    if ( RetValue == 0 )
    {
//        printf( "Failed 2!\n" );
        return 0;
    }

    // try removing fanins
//    printf( "Fanins: " );
    Counter = 0;
    Vec_VecClear( vResubs );
    Vec_VecClear( vResubsW );
    // get the best fanins
    iBest = Res_FilterCriticalFanin( pWin->pNode );
    if ( iBest == -1 )
        return 0;

    // get the info without the critical fanin
    pInfo = Res_FilterCollectFaninInfo( pWin, pSim, ~(1 << iBest) );
    RetValue = Abc_InfoIsOne( pInfo, pSim->nWordsOut );
    if ( RetValue )
    {
//        printf( "Can be done without one!\n" );
        // collect the nodes
        Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,0) );
        Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,1) );
        Abc_ObjForEachFanin( pWin->pNode, pFanin, k )
        {
            if ( k != iBest )
            {
                Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,2+k) );
                Vec_VecPush( vResubsW, Counter, pFanin );
            }
        }
        Counter++;
//        printf( "*" );
        return Counter;
    }

    // go through the divisors
    for ( d = Abc_ObjFaninNum(pWin->pNode) + 2; d < Abc_NtkPoNum(pAig); d++ )
    {
        pInfoDiv = (unsigned *)Vec_PtrEntry( pSim->vOuts, d );
        iDiv = d - (Abc_ObjFaninNum(pWin->pNode) + 2);
        if ( !Abc_InfoIsOrOne( pInfo, pInfoDiv, pSim->nWordsOut ) )
            continue;
//if ( Abc_ObjLevel(pWin->pNode) <= Abc_ObjLevel( Vec_PtrEntry(pWin->vDivs, iDiv) ) )
//    printf( "Node level = %d. Divisor level = %d.\n", Abc_ObjLevel(pWin->pNode), Abc_ObjLevel( Vec_PtrEntry(pWin->vDivs, iDiv) ) );
        // collect the nodes
        Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,0) );
        Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,1) );
        // collect the remaning fanins and the divisor
        Abc_ObjForEachFanin( pWin->pNode, pFanin, k )
        {
            if ( k != iBest )
            {
                Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,2+k) );
                Vec_VecPush( vResubsW, Counter, pFanin );
            }
        }
        // collect the divisor
        Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,d) );
        Vec_VecPush( vResubsW, Counter, Vec_PtrEntry(pWin->vDivs, iDiv) );
        Counter++;

        if ( Counter == Vec_VecSize(vResubs) )
            break;            
    }

    if ( Counter > 0 || Abc_ObjFaninNum(pWin->pNode) >= nFaninsMax )
        return Counter;

    // try to find the node pairs
    for ( d = Abc_ObjFaninNum(pWin->pNode) + 2; d < Abc_NtkPoNum(pAig); d++ )
    {
        pInfoDiv = (unsigned *)Vec_PtrEntry( pSim->vOuts, d );
        iDiv = d - (Abc_ObjFaninNum(pWin->pNode) + 2);
        // go through the second divisor
        for ( d2 = d + 1; d2 < Abc_NtkPoNum(pAig); d2++ )
        {
            pInfoDiv2 = (unsigned *)Vec_PtrEntry( pSim->vOuts, d2 );
            iDiv2 = d2 - (Abc_ObjFaninNum(pWin->pNode) + 2);

            if ( !Abc_InfoIsOrOne3( pInfo, pInfoDiv, pInfoDiv2, pSim->nWordsOut ) )
                continue;
            // collect the nodes
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,0) );
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,1) );
            // collect the remaning fanins and the divisor
            Abc_ObjForEachFanin( pWin->pNode, pFanin, k )
            {
                if ( k != iBest )
                {
                    Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,2+k) );
                    Vec_VecPush( vResubsW, Counter, pFanin );
                }
            }
            // collect the divisor
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,d) );
            Vec_VecPush( vResubs, Counter, Abc_NtkPo(pAig,d2) );
            Vec_VecPush( vResubsW, Counter, Vec_PtrEntry(pWin->vDivs, iDiv) );
            Vec_VecPush( vResubsW, Counter, Vec_PtrEntry(pWin->vDivs, iDiv2) );
            Counter++;

            if ( Counter == Vec_VecSize(vResubs) )
                break;            
        }
        if ( Counter == Vec_VecSize(vResubs) )
            break;            
    }
    return Counter;
}